

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  tensor *ptVar1;
  longlong lVar2;
  tensor *beta;
  resizable_tensor *prVar3;
  resizable_tensor *dest;
  resizable_tensor *in_RDX;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  double decay;
  alias_tensor_instance b;
  alias_tensor_instance g;
  alias_tensor *in_stack_00000148;
  tensor *in_stack_fffffffffffffeb8;
  tensor *in_stack_fffffffffffffec0;
  tensor *in_stack_fffffffffffffec8;
  resizable_tensor *in_stack_fffffffffffffed0;
  resizable_tensor *in_stack_fffffffffffffed8;
  double in_stack_fffffffffffffee0;
  double averaging_factor;
  double eps;
  
  auVar4 = in_ZMM0._0_16_;
  auVar5 = in_ZMM1._0_16_;
  alias_tensor::operator()(in_stack_00000148,(tensor *)this,(size_t)sub);
  alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
  alias_tensor::operator()(in_stack_00000148,(tensor *)this,(size_t)sub);
  ptVar1 = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
                         *)0x1f0ca8);
  lVar2 = tensor::num_samples(ptVar1);
  if (lVar2 < 2) {
    ptVar1 = *(tensor **)(in_RDI + 0x3b8);
    prVar3 = (resizable_tensor *)
             dimpl::
             subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
             ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
                           *)0x1f0e72);
    tt::batch_normalize_conv_inference
              (in_stack_fffffffffffffee0,prVar3,&in_RDX->super_tensor,ptVar1,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(tensor *)0x1f0eb7);
  }
  else {
    auVar4 = vcvtusi2sd_avx512f(auVar4,*(undefined8 *)(in_RDI + 0x388));
    auVar5 = vcvtusi2sd_avx512f(auVar5,*(undefined8 *)(in_RDI + 0x388));
    eps = 1.0 - auVar4._0_8_ / (auVar5._0_8_ + 1.0);
    *(long *)(in_RDI + 0x388) = *(long *)(in_RDI + 0x388) + 1;
    if (*(ulong *)(in_RDI + 0x390) < *(ulong *)(in_RDI + 0x388)) {
      *(undefined8 *)(in_RDI + 0x388) = *(undefined8 *)(in_RDI + 0x390);
    }
    averaging_factor = *(double *)(in_RDI + 0x3b8);
    prVar3 = (resizable_tensor *)(in_RDI + 0x128);
    dest = (resizable_tensor *)(in_RDI + 600);
    ptVar1 = (tensor *)(in_RDI + 0x2f0);
    beta = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
                         *)0x1f0dee);
    tt::batch_normalize_conv
              (eps,dest,prVar3,in_RDX,averaging_factor,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,ptVar1,beta);
  }
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1f0ec8);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1f0ed5);
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto g = gamma(params,0);
            auto b = beta(params,gamma.size());
            if (sub.get_output().num_samples() > 1)
            {
                const double decay = 1.0 - num_updates/(num_updates+1.0);
                ++num_updates;
                if (num_updates > running_stats_window_size)
                    num_updates = running_stats_window_size;

                if (mode == FC_MODE)
                    tt::batch_normalize(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
                else 
                    tt::batch_normalize_conv(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
            }
            else // we are running in testing mode so we just linearly scale the input tensor.
            {
                if (mode == FC_MODE)
                    tt::batch_normalize_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
                else
                    tt::batch_normalize_conv_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
            }
        }